

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O0

SRes LzmaEnc_MemEncode(CLzmaEncHandle pp,Byte *dest,SizeT *destLen,Byte *src,SizeT srcLen,
                      int writeEndMark,ICompressProgress *progress,ISzAlloc *alloc,
                      ISzAlloc *allocBig)

{
  SizeT *in_RDX;
  undefined8 in_RSI;
  CLzmaEncHandle in_RDI;
  long in_R8;
  undefined4 in_R9D;
  CSeqOutStreamBuf outStream;
  CLzmaEnc *p;
  SRes res;
  ISzAlloc *in_stack_ffffffffffffff98;
  code *p_00;
  SizeT srcLen_00;
  int iVar1;
  uint in_stack_ffffffffffffffbc;
  SRes local_38;
  SRes local_4;
  
  p_00 = MyWrite;
  srcLen_00 = *in_RDX;
  iVar1 = 0;
  *(undefined4 *)((long)in_RDI + 0x84) = in_R9D;
  *(undefined1 **)((long)in_RDI + 0xe8) = &stack0xffffffffffffffa0;
  local_38 = LzmaEnc_MemPrepare(in_RDI,(Byte *)((ulong)in_stack_ffffffffffffffbc << 0x20),srcLen_00,
                                (UInt32)((ulong)in_RSI >> 0x20),(ISzAlloc *)MyWrite,
                                in_stack_ffffffffffffff98);
  if (((local_38 == 0) &&
      (local_38 = LzmaEnc_Encode2((CLzmaEnc *)p_00,(ICompressProgress *)in_stack_ffffffffffffff98),
      local_38 == 0)) && (*(long *)((long)in_RDI + 0x98) != in_R8)) {
    local_38 = 0xb;
  }
  *in_RDX = *in_RDX - srcLen_00;
  if (iVar1 == 0) {
    local_4 = local_38;
  }
  else {
    local_4 = 7;
  }
  return local_4;
}

Assistant:

SRes LzmaEnc_MemEncode(CLzmaEncHandle pp, Byte *dest, SizeT *destLen, const Byte *src, SizeT srcLen,
    int writeEndMark, ICompressProgress *progress, ISzAlloc *alloc, ISzAlloc *allocBig)
{
  SRes res;
  CLzmaEnc *p = (CLzmaEnc *)pp;

  CSeqOutStreamBuf outStream;

  outStream.funcTable.Write = MyWrite;
  outStream.data = dest;
  outStream.rem = *destLen;
  outStream.overflow = False;

  p->writeEndMark = writeEndMark;
  p->rc.outStream = &outStream.funcTable;

  res = LzmaEnc_MemPrepare(pp, src, srcLen, 0, alloc, allocBig);
  
  if (res == SZ_OK)
  {
    res = LzmaEnc_Encode2(p, progress);
    if (res == SZ_OK && p->nowPos64 != srcLen)
      res = SZ_ERROR_FAIL;
  }

  *destLen -= outStream.rem;
  if (outStream.overflow)
    return SZ_ERROR_OUTPUT_EOF;
  return res;
}